

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O3

EC_T_BOOL __thiscall
CAtEmLogging::OsDbgMsgHook(CAtEmLogging *this,EC_T_CHAR *szFormat,__va_list_tag *vaArgs)

{
  MSG_BUFFER_DESC *pMsgBufferDesc;
  EC_T_BOOL EVar1;
  
  EVar1 = 1;
  if (((this->m_bDbgMsgHookEnable != 0) &&
      (pMsgBufferDesc = this->m_pAllMsgBufferDesc, pMsgBufferDesc != (MSG_BUFFER_DESC *)0x0)) &&
     (pMsgBufferDesc->bIsInitialized != 0)) {
    EVar1 = 0;
    InsertNewMsg(this,pMsgBufferDesc,szFormat,vaArgs,0,1);
  }
  return EVar1;
}

Assistant:

EC_T_BOOL CAtEmLogging::OsDbgMsgHook(const EC_T_CHAR* szFormat, EC_T_VALIST vaArgs)
{
EC_T_BOOL bPrint;

    bPrint = !m_bDbgMsgHookEnable;  // print messages outside as long as hook is not enabled
    if (m_bDbgMsgHookEnable)
    {
        if (m_pAllMsgBufferDesc != EC_NULL )
        {
            if (m_pAllMsgBufferDesc->bIsInitialized )
            {
                InsertNewMsg( m_pAllMsgBufferDesc, szFormat, vaArgs, EC_FALSE, EC_TRUE );
            }
            else
            {
                bPrint = EC_TRUE;
            }
        }
        else
        {
            bPrint = EC_TRUE;
        }
/*
        else
        {
            EC_T_CHAR   szMsg[256];

            OsVsnprintf(szMsg, 256, szFormat, vaArgs);
#ifdef VXWORKS
            logMsg( "%s", (int)szMsg, 2,3,4,5,6 );
#else
#if !(defined NOPRINTF)
            OsPrintf( "%s", szMsg );
#endif
#endif
        }
*/
    }
    return bPrint;
}